

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

RecyclableObject *
Js::JavascriptArray::ObjectSpliceHelper<unsigned_long>
          (RecyclableObject *pObj,unsigned_long len,unsigned_long start,unsigned_long deleteLen,
          Var *insertArgs,uint32 insertLen,ScriptContext *scriptContext,RecyclableObject *pNewObj)

{
  BigIndex idxDest;
  BOOL BVar1;
  uint uVar2;
  ThreadContext *threadContext;
  JavascriptLibrary *this;
  JavascriptArray *instance;
  Var pvVar3;
  Var *aItem;
  BigIndex index;
  BigIndex local_158;
  BigIndex local_148;
  uint64 local_138;
  unsigned_long newLen;
  uint local_11c;
  unsigned_long uStack_118;
  uint32 i_4;
  unsigned_long dstIndex;
  unsigned_long i_3;
  Var element_2;
  ulong uStack_f8;
  BOOL hasItem_2;
  unsigned_long i_2;
  unsigned_long j;
  undefined1 local_d8 [8];
  ThrowTypeErrorOnFailureHelper h;
  Var element_1;
  ulong uStack_98;
  BOOL hasItem_1;
  unsigned_long i_1;
  BigIndex k;
  Var element;
  BOOL hasItem;
  uint32 i;
  JavascriptArray *pnewArr;
  undefined1 local_58 [8];
  JsReentLock jsReentLock;
  uint32 insertLen_local;
  Var *insertArgs_local;
  unsigned_long deleteLen_local;
  unsigned_long start_local;
  unsigned_long len_local;
  RecyclableObject *pObj_local;
  
  aItem = insertArgs;
  jsReentLock._28_4_ = insertLen;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_58,threadContext);
  JsReentLock::setObjectForMutation((JsReentLock *)local_58,pObj);
  if (pNewObj == (RecyclableObject *)0x0) {
    JsReentLock::unlock((JsReentLock *)local_58);
    aItem = (Var *)0x0;
    pNewObj = ArraySpeciesCreate<unsigned_long>
                        (pObj,deleteLen,scriptContext,(bool *)0x0,(bool *)0x0,(bool *)0x0);
    JsReentLock::relock((JsReentLock *)local_58);
    if (pNewObj == (RecyclableObject *)0x0) {
      if (0xffffffff < deleteLen) {
        JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec5b,(PCWSTR)0x0);
      }
      this = ScriptContext::GetLibrary(scriptContext);
      insertArgs_local._0_4_ = (uint32)deleteLen;
      pNewObj = (RecyclableObject *)JavascriptLibrary::CreateArray(this,(uint32)insertArgs_local);
      EnsureHead<void*>((JavascriptArray *)pNewObj);
    }
  }
  instance = TryVarToNonES5Array(pNewObj);
  if (instance == (JavascriptArray *)0x0) {
    BigIndex::BigIndex((BigIndex *)&i_1,0);
    for (uStack_98 = 0; uStack_98 < deleteLen; uStack_98 = uStack_98 + 1) {
      JsReentLock::unlock((JsReentLock *)local_58);
      BVar1 = Js::JavascriptOperators::HasItem(pObj,start + uStack_98);
      JsReentLock::MutateArrayObject((JsReentLock *)local_58);
      JsReentLock::relock((JsReentLock *)local_58);
      if (BVar1 != 0) {
        JsReentLock::unlock((JsReentLock *)local_58);
        pvVar3 = Js::JavascriptOperators::GetItem(pObj,start + uStack_98,scriptContext);
        idxDest.bigIndex = (uint64)pvVar3;
        idxDest.index = k.index;
        idxDest._4_4_ = k._4_4_;
        uVar2 = SetArrayLikeObjects((JavascriptArray *)pNewObj,
                                    (RecyclableObject *)(i_1 & 0xffffffff),idxDest,aItem);
        h.m_functionName = (PCWSTR)i_1;
        index.bigIndex = (uint64)aItem;
        index.index = k.index;
        index._4_4_ = k._4_4_;
        ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar2,(BOOL)scriptContext,
                            (ScriptContext *)(i_1 & 0xffffffff),index);
        JsReentLock::MutateArrayObject((JsReentLock *)local_58);
        JsReentLock::relock((JsReentLock *)local_58);
      }
      BigIndex::operator++((BigIndex *)&i_1);
    }
  }
  else {
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(instance);
    JsReentLock::setSecondObjectForMutation((JsReentLock *)local_58,instance);
    for (element._4_4_ = 0; element._4_4_ < deleteLen; element._4_4_ = element._4_4_ + 1) {
      JsReentLock::unlock((JsReentLock *)local_58);
      BVar1 = Js::JavascriptOperators::HasItem(pObj,start + element._4_4_);
      JsReentLock::MutateArrayObject((JsReentLock *)local_58);
      JsReentLock::relock((JsReentLock *)local_58);
      if (BVar1 != 0) {
        JsReentLock::unlock((JsReentLock *)local_58);
        k.bigIndex = (uint64)Js::JavascriptOperators::GetItem
                                       (pObj,start + element._4_4_,scriptContext);
        JsReentLock::MutateArrayObject((JsReentLock *)local_58);
        JsReentLock::relock((JsReentLock *)local_58);
        (*(instance->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (instance,(ulong)element._4_4_,k.bigIndex,0);
      }
    }
  }
  ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailureHelper
            ((ThrowTypeErrorOnFailureHelper *)local_d8,scriptContext,L"Array.prototype.splice");
  if (deleteLen < (uint)jsReentLock._28_4_) {
    JsReentLock::unlock((JsReentLock *)local_58);
    BigIndex::BigIndex((BigIndex *)&j,start + (uint)jsReentLock._28_4_);
    Unshift<Js::JavascriptArray::BigIndex,unsigned_long>
              (pObj,(BigIndex *)&j,start + deleteLen,len,scriptContext);
    JsReentLock::MutateArrayObject((JsReentLock *)local_58);
    JsReentLock::relock((JsReentLock *)local_58);
  }
  else if ((uint)jsReentLock._28_4_ < deleteLen) {
    i_2 = 0;
    for (uStack_f8 = start + deleteLen; dstIndex = len, uStack_f8 < len; uStack_f8 = uStack_f8 + 1)
    {
      JsReentLock::unlock((JsReentLock *)local_58);
      element_2._4_4_ = Js::JavascriptOperators::HasItem(pObj,uStack_f8);
      JsReentLock::MutateArrayObject((JsReentLock *)local_58);
      JsReentLock::relock((JsReentLock *)local_58);
      if (element_2._4_4_ == 0) {
        JsReentLock::unlock((JsReentLock *)local_58);
        BVar1 = Js::JavascriptOperators::DeleteItem
                          (pObj,start + (uint)jsReentLock._28_4_ + i_2,
                           PropertyOperation_ThrowOnDeleteIfNotConfig);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)local_d8,BVar1);
        JsReentLock::MutateArrayObject((JsReentLock *)local_58);
        JsReentLock::relock((JsReentLock *)local_58);
      }
      else {
        i_3 = 0;
        JsReentLock::unlock((JsReentLock *)local_58);
        i_3 = (unsigned_long)Js::JavascriptOperators::GetItem(pObj,uStack_f8,scriptContext);
        BVar1 = Js::JavascriptOperators::SetItem
                          (pObj,pObj,start + (uint)jsReentLock._28_4_ + i_2,(Var)i_3,scriptContext,
                           PropertyOperation_ThrowIfNotExtensible);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)local_d8,BVar1);
        JsReentLock::MutateArrayObject((JsReentLock *)local_58);
        JsReentLock::relock((JsReentLock *)local_58);
      }
      i_2 = i_2 + 1;
    }
    for (; (len - deleteLen) + (ulong)(uint)jsReentLock._28_4_ < dstIndex; dstIndex = dstIndex - 1)
    {
      JsReentLock::unlock((JsReentLock *)local_58);
      BVar1 = Js::JavascriptOperators::DeleteItem
                        (pObj,dstIndex - 1,PropertyOperation_ThrowOnDeleteIfNotConfig);
      ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                ((ThrowTypeErrorOnFailureHelper *)local_d8,BVar1);
      JsReentLock::MutateArrayObject((JsReentLock *)local_58);
      JsReentLock::relock((JsReentLock *)local_58);
    }
  }
  if (jsReentLock._28_4_ != 0) {
    uStack_118 = start;
    for (local_11c = 0; local_11c < (uint)jsReentLock._28_4_; local_11c = local_11c + 1) {
      JsReentLock::unlock((JsReentLock *)local_58);
      BigIndex::BigIndex((BigIndex *)&newLen,uStack_118);
      BVar1 = IndexTrace<Js::JavascriptArray::BigIndex>::SetItem
                        (pObj,(BigIndex *)&newLen,insertArgs[local_11c],
                         PropertyOperation_ThrowIfNotExtensible);
      ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                ((ThrowTypeErrorOnFailureHelper *)local_d8,BVar1);
      JsReentLock::MutateArrayObject((JsReentLock *)local_58);
      JsReentLock::relock((JsReentLock *)local_58);
      uStack_118 = uStack_118 + 1;
    }
  }
  local_138 = (len - deleteLen) + (ulong)(uint)jsReentLock._28_4_;
  JsReentLock::unlock((JsReentLock *)local_58);
  BigIndex::BigIndex(&local_148,local_138);
  pvVar3 = IndexTrace<Js::JavascriptArray::BigIndex>::ToNumber(&local_148,scriptContext);
  BVar1 = Js::JavascriptOperators::SetProperty
                    (pObj,pObj,0xd1,pvVar3,scriptContext,PropertyOperation_ThrowIfNotExtensible);
  ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
            ((ThrowTypeErrorOnFailureHelper *)local_d8,BVar1);
  BigIndex::BigIndex(&local_158,deleteLen);
  pvVar3 = IndexTrace<Js::JavascriptArray::BigIndex>::ToNumber(&local_158,scriptContext);
  BVar1 = Js::JavascriptOperators::SetProperty
                    (pNewObj,pNewObj,0xd1,pvVar3,scriptContext,
                     PropertyOperation_ThrowIfNotExtensible);
  ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
            ((ThrowTypeErrorOnFailureHelper *)local_d8,BVar1);
  JsReentLock::MutateArrayObject((JsReentLock *)local_58);
  JsReentLock::relock((JsReentLock *)local_58);
  if (instance != (JavascriptArray *)0x0) {
    (*(instance->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_58);
  return pNewObj;
}

Assistant:

RecyclableObject* JavascriptArray::ObjectSpliceHelper(RecyclableObject* pObj, T len, T start,
        T deleteLen, Var* insertArgs, uint32 insertLen, ScriptContext *scriptContext, RecyclableObject* pNewObj)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pObj);

        JavascriptArray *pnewArr = nullptr;

        if (pNewObj == nullptr)
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, pNewObj = ArraySpeciesCreate(pObj, deleteLen, scriptContext));
            if (pNewObj == nullptr)
            {
                if (deleteLen > UINT_MAX)
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
                }

                pnewArr = scriptContext->GetLibrary()->CreateArray(static_cast<uint32>(deleteLen));
                pnewArr->EnsureHead<Var>();

                pNewObj = pnewArr;
            }
        }

        pnewArr = JavascriptArray::TryVarToNonES5Array(pNewObj);
        if (pnewArr)
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(pnewArr);
#endif
            SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, pnewArr);
        }

        // copy elements to delete to new array
        if (pnewArr != nullptr)
        {
            for (uint32 i = 0; i < deleteLen; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, start + i));
                if (hasItem)
                {
                    JS_REENTRANT(jsReentLock, Var element = JavascriptOperators::GetItem(pObj, start + i, scriptContext));
                    pnewArr->SetItem(i, element, PropertyOperation_None);
                }
            }
        }
        else
        {
            BigIndex k = 0u;
            for (T i = 0u; i < deleteLen; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, start + i));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(pObj, start + i, scriptContext),
                        ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(pNewObj, k, element), scriptContext, k));
                }
                ++k;
            }
        }

        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.splice"));

        // Now we need reserve room if it is necessary
        if (insertLen > deleteLen) // Might overflow max array length
        {
            // Unshift [start + deleteLen, len) to start + insertLen
            JS_REENTRANT(jsReentLock, Unshift<BigIndex, T>(pObj, start + insertLen, start + deleteLen, len, scriptContext));
        }
        else if (insertLen < deleteLen) // Won't overflow max array length
        {
            T j = 0;
            for (T i = start + deleteLen; i < len; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, i));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(pObj, i, scriptContext),
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(pObj, pObj, start + insertLen + j, element, scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(pObj, start + insertLen + j, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }
                j++;
            }

            // Clean up the rest
            for (T i = len; i > len - deleteLen + insertLen; i--)
            {
                JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(pObj, i - 1, PropertyOperation_ThrowOnDeleteIfNotConfig)));
            }
        }

        if (insertLen > 0)
        {
            T dstIndex = start; // insert index might overflow max array length
            for (uint32 i = 0; i < insertLen; i++)
            {
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(IndexTrace<BigIndex>::SetItem(pObj, dstIndex, insertArgs[i], PropertyOperation_ThrowIfNotExtensible)));
                ++dstIndex;
            }
        }

        // Set up new length
        T newLen = T(len - deleteLen) + insertLen;
        JS_REENTRANT(jsReentLock,
            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(pObj, pObj, PropertyIds::length, IndexTrace<BigIndex>::ToNumber(newLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)),
            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(pNewObj, pNewObj, PropertyIds::length, IndexTrace<BigIndex>::ToNumber(deleteLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
#ifdef VALIDATE_ARRAY
        if (pnewArr)
        {
            pnewArr->ValidateArray();
        }
#endif
        return pNewObj;
    }